

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

StopPx * __thiscall Application::queryStopPx(StopPx *__return_storage_ptr__,Application *this)

{
  double in_RAX;
  ostream *poVar1;
  double value;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"StopPx: ",8);
  std::istream::_M_extract<double>((double *)&std::cin);
  FIX::DoubleField::DoubleField(&__return_storage_ptr__->super_PriceField,99,in_RAX,0);
  (__return_storage_ptr__->super_PriceField).super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_00152c90;
  return __return_storage_ptr__;
}

Assistant:

FIX::StopPx Application::queryStopPx() {
  double value;
  std::cout << std::endl << "StopPx: ";
  std::cin >> value;
  return FIX::StopPx(value);
}